

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O2

void __thiscall docopt::value::~value(value *this)

{
  if (this->kind == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(this->variant).strList);
    return;
  }
  if (this->kind == String) {
    std::__cxx11::string::~string((string *)&(this->variant).strValue);
    return;
  }
  return;
}

Assistant:

inline
	value::~value()
	{
		switch (kind) {
			case Kind::String:
				variant.strValue.~basic_string();
				break;

			case Kind::StringList:
				variant.strList.~vector();
				break;

			case Kind::Empty:
			case Kind::Bool:
			case Kind::Long:
			default:
				// trivial dtor
				break;
		}
	}